

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::BlendingCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 300 es\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp vec4 u_special;\nvoid main ()\n{\n\tfragColor = u_special;\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string BlendingCase::genFragmentSource (void) const
{
	return
		"#version 300 es\n"
		"layout(location = 0) out highp vec4 fragColor;\n"
		"uniform highp vec4 u_special;\n"
		"void main ()\n"
		"{\n"
		"	fragColor = u_special;\n"
		"}\n";
}